

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O1

void __thiscall cmRST::ProcessModule(cmRST *this,istream *is)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  ulong *puVar7;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string rst;
  string line;
  string local_d8;
  undefined1 *local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  RegularExpression *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_b8 = &local_a8;
  local_b0 = (char *)0x0;
  local_a8 = 0;
  local_38 = &this->ModuleRST;
LAB_0021ec78:
  do {
    while( true ) {
      while( true ) {
        bVar2 = cmsys::SystemTools::GetLineFromStream(is,&local_58,(bool *)0x0,0xffffffffffffffff);
        if (!bVar2) {
          iVar3 = std::__cxx11::string::compare((char *)&local_b8);
          if (iVar3 == 0) {
            Reset(this);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          return;
        }
        if ((local_b0 == (char *)0x0) ||
           (iVar3 = std::__cxx11::string::compare((char *)&local_b8), iVar3 == 0)) break;
        lVar4 = std::__cxx11::string::find((char *)&local_58,(ulong)local_b8,0);
        if (lVar4 == -1) {
          ProcessLine(this,&local_58);
        }
        else {
          if (*local_58._M_dataplus._M_p != '#') {
            std::__cxx11::string::resize((ulong)&local_58,(char)lVar4);
            ProcessLine(this,&local_58);
          }
          local_b0 = (char *)0x0;
          *local_b8 = 0;
          Reset(this);
          this->OutputLinePending = true;
        }
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_b8);
      if (iVar3 == 0) break;
LAB_0021ed1f:
      iVar3 = std::__cxx11::string::compare((char *)&local_58);
      if (iVar3 == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x7e6622);
      }
      else {
        bVar2 = cmsys::RegularExpression::find
                          (local_38,local_58._M_dataplus._M_p,&local_38->regmatch);
        if (bVar2) {
          pcVar1 = (this->ModuleRST).regmatch.startp[1];
          if (pcVar1 == (char *)0x0) {
            local_98 = &local_88;
            local_90 = 0;
            local_88 = 0;
          }
          else {
            local_98 = &local_88;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,pcVar1,(this->ModuleRST).regmatch.endp[1]);
          }
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x8289b8);
          local_78 = &local_68;
          plVar6 = plVar5 + 2;
          if ((long *)*plVar5 == plVar6) {
            local_68 = *plVar6;
            lStack_60 = plVar5[3];
          }
          else {
            local_68 = *plVar6;
            local_78 = (long *)*plVar5;
          }
          local_70 = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
          puVar7 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_d8.field_2._M_allocated_capacity = *puVar7;
            local_d8.field_2._8_8_ = plVar5[3];
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *puVar7;
            local_d8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_d8._M_string_length = plVar5[1];
          *plVar5 = (long)puVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if (local_78 != &local_68) {
            operator_delete(local_78,local_68 + 1);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
          }
        }
      }
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar3 != 0) {
      local_d8._M_dataplus._M_p = (pointer)local_58._M_string_length;
      local_d8._M_string_length = (size_type)local_58._M_dataplus._M_p;
      __str._M_str = "# ";
      __str._M_len = 2;
      iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_d8,0,2,__str);
      if (iVar3 != 0) {
        local_b0 = (char *)0x0;
        *local_b8 = 0;
        Reset(this);
        this->OutputLinePending = true;
        goto LAB_0021ed1f;
      }
      std::__cxx11::string::erase((ulong)&local_58,0);
      ProcessLine(this,&local_58);
      goto LAB_0021ec78;
    }
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity =
         local_d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    ProcessLine(this,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

void cmRST::ProcessModule(std::istream& is)
{
  std::string line;
  std::string rst;
  while (cmSystemTools::GetLineFromStream(is, line)) {
    if (!rst.empty() && rst != "#") {
      // Bracket mode: check for end bracket
      std::string::size_type pos = line.find(rst);
      if (pos == std::string::npos) {
        this->ProcessLine(line);
      } else {
        if (line[0] != '#') {
          line.resize(pos);
          this->ProcessLine(line);
        }
        rst.clear();
        this->Reset();
        this->OutputLinePending = true;
      }
    } else {
      // Line mode: check for .rst start (bracket or line)
      if (rst == "#") {
        if (line == "#") {
          this->ProcessLine("");
          continue;
        }
        if (cmHasLiteralPrefix(line, "# ")) {
          line.erase(0, 2);
          this->ProcessLine(line);
          continue;
        }
        rst.clear();
        this->Reset();
        this->OutputLinePending = true;
      }
      if (line == "#.rst:") {
        rst = "#";
      } else if (this->ModuleRST.find(line)) {
        rst = "]" + this->ModuleRST.match(1) + "]";
      }
    }
  }
  if (rst == "#") {
    this->Reset();
  }
}